

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

optional<long_long> anon_unknown.dwarf_96c7d3::qConvertToNumber(Private *d,bool allowStringToBool)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  Type TVar4;
  _Storage<long_long,_true> _Var5;
  ulong uVar6;
  Private *pPVar7;
  undefined8 unaff_RBP;
  undefined7 uVar8;
  _Storage<long_long,_true> unaff_R14;
  long in_FS_OFFSET;
  QLatin1StringView rhs;
  QLatin1StringView rhs_00;
  QLatin1StringView rhs_01;
  QLatin1StringView rhs_02;
  optional<long_long> oVar9;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringView lhs_02;
  bool ok;
  bool local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_31 = true;
  iVar1 = *(int *)((*(ulong *)&d->field_0x18 & 0xfffffffffffffffc) + 0xc);
  uVar8 = (undefined7)((ulong)unaff_RBP >> 8);
  switch(iVar1) {
  case 1:
    if ((d->field_0x18 & 1) != 0) {
      d = (Private *)
          ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i + (long)((d->data).shared)->offset);
    }
    _Var5._M_value._1_7_ = 0;
    _Var5._M_value._0_1_ = (d->data).data[0];
    break;
  case 2:
  case 4:
  case 6:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x26:
  case 0x28:
    goto switchD_002d6da0_caseD_2;
  case 3:
  case 5:
  case 0x23:
  case 0x24:
  case 0x25:
switchD_002d6da0_caseD_3:
    _Var5._M_value = qMetaTypeUNumber(d);
    break;
  case 7:
    if ((d->field_0x18 & 1) != 0) {
      d = (Private *)
          ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i + (long)((d->data).shared)->offset);
    }
    _Var5._M_value._2_6_ = 0;
    _Var5._M_value._0_2_ = *(ushort *)&d->data;
    break;
  case 8:
  case 9:
  case 0xb:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x27:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
switchD_002d6da0_caseD_8:
    uVar6 = *(ulong *)&d->field_0x18 & 0xfffffffffffffffc;
    if (((*(byte *)(uVar6 + 8) & 0x10) == 0) && (*(int *)(uVar6 + 0xc) != 0x34)) goto LAB_002d6fc2;
    _Var5._M_value = qMetaTypeNumberBySize(d);
    break;
  case 10:
    if ((d->field_0x18 & 1) != 0) {
      d = (Private *)
          ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i + (long)((d->data).shared)->offset);
    }
    _Var5._M_value = QString::toLongLong((QString *)d,&local_31,10);
    uVar6 = CONCAT71(uVar8,1);
    if (local_31 != false) goto LAB_002d6dc3;
    if (allowStringToBool) {
      lVar2 = *(qsizetype *)((long)&d->data + 0x10);
      if (((lVar2 == 5) &&
          (rhs.m_data = "false", rhs.m_size = 5, lhs.m_data = *(char16_t **)((long)&d->data + 8),
          lhs.m_size = 5, bVar3 = QtPrivate::equalStrings(lhs,rhs), bVar3)) ||
         ((lVar2 == 1 &&
          (rhs_00.m_data = "0", rhs_00.m_size = 1,
          lhs_00.m_data = *(char16_t **)((long)&d->data + 8), lhs_00.m_size = 1,
          bVar3 = QtPrivate::equalStrings(lhs_00,rhs_00), bVar3)))) {
        _Var5._M_value = 0;
        goto LAB_002d6dc3;
      }
      if (lVar2 == 4) {
        rhs_01.m_data = "true";
        rhs_01.m_size = 4;
        lhs_01.m_data = *(char16_t **)((long)&d->data + 8);
        lhs_01.m_size = 4;
        bVar3 = QtPrivate::equalStrings(lhs_01,rhs_01);
        unaff_R14._M_value = 1;
        _Var5._M_value = unaff_R14._M_value;
        if (bVar3) goto LAB_002d6dc3;
      }
      if (lVar2 == 1) {
        unaff_R14._M_value = 1;
        rhs_02.m_data = "1";
        rhs_02.m_size = 1;
        lhs_02.m_data = *(char16_t **)((long)&d->data + 8);
        lhs_02.m_size = 1;
        bVar3 = QtPrivate::equalStrings(lhs_02,rhs_02);
        _Var5._M_value = unaff_R14._M_value;
        if (bVar3) goto LAB_002d6dc3;
      }
    }
LAB_002d6fc2:
    uVar6 = 0;
    _Var5 = unaff_R14;
    goto LAB_002d6dc3;
  case 0xc:
    if ((d->field_0x18 & 1) != 0) {
      d = (Private *)
          ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i + (long)((d->data).shared)->offset);
    }
    _Var5._M_value = QByteArray::toLongLong((QByteArray *)d,&local_31,10);
    uVar6 = CONCAT71(uVar8,local_31);
    goto LAB_002d6dc3;
  case 0x2d:
    pPVar7 = d;
    if ((d->field_0x18 & 1) != 0) {
      pPVar7 = (Private *)
               ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
               (long)((d->data).shared)->offset);
    }
    TVar4 = QJsonValue::type((QJsonValue *)pPVar7);
    if (TVar4 != Double) goto switchD_002d6da0_caseD_8;
    goto switchD_002d6da0_caseD_2;
  default:
    if (iVar1 - 0x38U < 2) goto switchD_002d6da0_caseD_3;
    if (iVar1 != 0x35) goto switchD_002d6da0_caseD_8;
    pPVar7 = d;
    if ((*(ulong *)&d->field_0x18 & 1) != 0) {
      pPVar7 = (Private *)
               ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
               (long)((d->data).shared)->offset);
    }
    if (*(int *)((long)&pPVar7->data + 0x10) != 0) {
      pPVar7 = d;
      if ((*(ulong *)&d->field_0x18 & 1) != 0) {
        pPVar7 = (Private *)
                 ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
                 (long)((d->data).shared)->offset);
      }
      if (*(int *)((long)&pPVar7->data + 0x10) != 0x202) goto switchD_002d6da0_caseD_8;
    }
switchD_002d6da0_caseD_2:
    _Var5._M_value = qMetaTypeNumber(d);
  }
  uVar6 = CONCAT71(uVar8,1);
LAB_002d6dc3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  oVar9.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._8_8_ = uVar6 & 0xffffffff;
  oVar9.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_payload._M_value = _Var5._M_value;
  return (optional<long_long>)
         oVar9.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>;
}

Assistant:

static std::optional<qlonglong> qConvertToNumber(const QVariant::Private *d, bool allowStringToBool = false)
{
    bool ok;
    switch (d->typeInterface()->typeId) {
    case QMetaType::QString: {
        const QString &s = d->get<QString>();
        if (qlonglong l = s.toLongLong(&ok); ok)
            return l;
        if (allowStringToBool) {
            if (s == "false"_L1 || s == "0"_L1)
                return 0;
            if (s == "true"_L1 || s == "1"_L1)
                return 1;
        }
        return std::nullopt;
    }
    case QMetaType::QChar:
        return d->get<QChar>().unicode();
    case QMetaType::QByteArray:
        if (qlonglong l = d->get<QByteArray>().toLongLong(&ok); ok)
            return l;
        return std::nullopt;
    case QMetaType::Bool:
        return qlonglong(d->get<bool>());
    case QMetaType::QCborValue:
        if (!d->get<QCborValue>().isInteger() && !d->get<QCborValue>().isDouble())
            break;
        return qMetaTypeNumber(d);
    case QMetaType::QJsonValue:
        if (!d->get<QJsonValue>().isDouble())
            break;
        Q_FALLTHROUGH();
    case QMetaType::Double:
    case QMetaType::Int:
    case QMetaType::Char:
    case QMetaType::SChar:
    case QMetaType::Short:
    case QMetaType::Long:
    case QMetaType::Float:
    case QMetaType::LongLong:
        return qMetaTypeNumber(d);
    case QMetaType::ULongLong:
    case QMetaType::UInt:
    case QMetaType::UChar:
    case QMetaType::Char16:
    case QMetaType::Char32:
    case QMetaType::UShort:
    case QMetaType::ULong:
        return qlonglong(qMetaTypeUNumber(d));
    }

    if (d->typeInterface()->flags & QMetaType::IsEnumeration
        || d->typeInterface()->typeId == QMetaType::QCborSimpleType)
        return qMetaTypeNumberBySize(d);

    return std::nullopt;
}